

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMReader.cc
# Opt level: O0

bool __thiscall
OpenMesh::IO::_OMReader_::read_binary_mesh_chunk
          (_OMReader_ *this,istream *_is,BaseImporter *_bi,Options *param_3,bool _swap)

{
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  BaseProperty *_bp;
  size_t sVar3;
  size_t size_of;
  size_t b;
  bool _swap_local;
  Options *param_3_local;
  BaseImporter *_bi_local;
  istream *_is_local;
  _OMReader_ *this_local;
  
  if (((uint)this->chunk_header_ >> 2 & 7) == 1) {
    uVar1 = this->bytes_;
    if (((uint)this->chunk_header_ >> 5 & 0xf) == 6) {
      iVar2 = (*_bi->_vptr_BaseImporter[0x19])();
      _bp = BaseKernel::_get_mprop
                      ((BaseKernel *)CONCAT44(extraout_var,iVar2),
                       &(this->property_name_).super_string);
      sVar3 = restore_binary_custom_data(this,_is,_bp,1,_swap);
      this->bytes_ = sVar3 + this->bytes_;
    }
    else {
      sVar3 = OMFormat::chunk_data_size(&this->header_,&this->chunk_header_);
      std::istream::ignore((long)_is);
      this->bytes_ = sVar3 + this->bytes_;
    }
    return uVar1 < this->bytes_;
  }
  __assert_fail("chunk_header_.entity_ == Chunk::Entity_Mesh",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/IO/reader/OMReader.cc"
                ,0x1f9,
                "bool OpenMesh::IO::_OMReader_::read_binary_mesh_chunk(std::istream &, BaseImporter &, Options &, bool) const"
               );
}

Assistant:

bool _OMReader_::read_binary_mesh_chunk(std::istream &_is, BaseImporter &_bi, Options & /* _opt */, bool _swap) const
{
  using OMFormat::Chunk;

  assert( chunk_header_.entity_ == Chunk::Entity_Mesh);

  size_t b = bytes_;

  switch (chunk_header_.type_) {
    case Chunk::Type_Custom:

      bytes_ += restore_binary_custom_data(_is, _bi.kernel()->_get_mprop(property_name_), 1, _swap);

      break;

    default:
      // skip unknown chunk
      size_t size_of = OMFormat::chunk_data_size(header_, chunk_header_);
      _is.ignore(size_of);
      bytes_ += size_of;
  }

  return b < bytes_;
}